

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)

{
  SUNMemoryHelper_Ops pSVar1;
  SUNContext in_RDI;
  SUNMemoryHelper helper;
  SUNContext sunctx_local_scope_;
  SUNMemoryHelper local_8;
  
  if (in_RDI == (SUNContext)0x0) {
    local_8 = (SUNMemoryHelper)0x0;
  }
  else {
    local_8 = (SUNMemoryHelper)malloc(0x18);
    pSVar1 = (SUNMemoryHelper_Ops)malloc(0x38);
    local_8->ops = pSVar1;
    memset(local_8->ops,0,0x38);
    local_8->content = (void *)0x0;
    local_8->sunctx = in_RDI;
  }
  return local_8;
}

Assistant:

SUNMemoryHelper SUNMemoryHelper_NewEmpty(SUNContext sunctx)
{
  if (sunctx == NULL) { return NULL; }

  SUNFunctionBegin(sunctx);
  SUNMemoryHelper helper = NULL;

  helper = (SUNMemoryHelper)malloc(sizeof(struct SUNMemoryHelper_));
  SUNAssertNull(helper, SUN_ERR_MALLOC_FAIL);

  helper->ops = (SUNMemoryHelper_Ops)malloc(sizeof(struct SUNMemoryHelper_Ops_));
  SUNAssertNull(helper->ops, SUN_ERR_MALLOC_FAIL);

  /* Set all ops to NULL */
  memset(helper->ops, 0, sizeof(struct SUNMemoryHelper_Ops_));
  helper->content = NULL;
  helper->sunctx  = sunctx;

  return helper;
}